

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall absl::Mutex::TryLock(Mutex *this)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  uVar2 = uVar1;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    uVar2 = (this->mu_).super___atomic_base<long>._M_i;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
      uVar2 = uVar1;
    }
    UNLOCK();
    if (!bVar3) goto LAB_0013f97b;
    DebugOnlyLockEnter(this);
LAB_0013f9a3:
    bVar3 = true;
  }
  else {
LAB_0013f97b:
    if ((uVar2 & 0x10) != 0) {
      if ((uVar2 & 9) == 0) {
        LOCK();
        bVar3 = uVar2 == (this->mu_).super___atomic_base<long>._M_i;
        if (bVar3) {
          (this->mu_).super___atomic_base<long>._M_i = uVar2 | 8;
        }
        UNLOCK();
        if (bVar3) {
          DebugOnlyLockEnter(this);
          PostSynchEvent(this,0);
          goto LAB_0013f9a3;
        }
      }
      PostSynchEvent(this,1);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Mutex::TryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & (kMuWriter | kMuReader | kMuEvent)) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(v, kMuWriter | v,
                                  std::memory_order_acquire,
                                  std::memory_order_relaxed)) {
    DebugOnlyLockEnter(this);
    ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
    return true;
  }
  if ((v & kMuEvent) != 0) {              // we're recording events
    if ((v & kExclusive->slow_need_zero) == 0 &&  // try fast acquire
        mu_.compare_exchange_strong(
            v, (kExclusive->fast_or | v) + kExclusive->fast_add,
            std::memory_order_acquire, std::memory_order_relaxed)) {
      DebugOnlyLockEnter(this);
      PostSynchEvent(this, SYNCH_EV_TRYLOCK_SUCCESS);
      ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
      return true;
    } else {
      PostSynchEvent(this, SYNCH_EV_TRYLOCK_FAILED);
    }
  }
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}